

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkdiskcache.cpp
# Opt level: O1

qint64 __thiscall QNetworkDiskCache::expire(QNetworkDiskCache *this)

{
  QArrayData *pQVar1;
  long lVar2;
  QSharedDataPointer<QNetworkCacheMetaDataPrivate> QVar3;
  QSharedDataPointer<QNetworkCacheMetaDataPrivate> QVar4;
  char cVar5;
  QSharedDataPointer<QNetworkCacheMetaDataPrivate> QVar6;
  QSharedDataPointer<QNetworkCacheMetaDataPrivate> QVar7;
  QSharedDataPointer<QNetworkCacheMetaDataPrivate> *pQVar8;
  QSharedDataPointer<QNetworkCacheMetaDataPrivate> *pQVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  iterator __end1;
  QSharedDataPointer<QNetworkCacheMetaDataPrivate> *pQVar15;
  QSharedDataPointer<QNetworkCacheMetaDataPrivate> *pQVar16;
  QNetworkDiskCachePrivate *d;
  __normal_iterator<CacheItem_*,_std::vector<CacheItem,_std::allocator<CacheItem>_>_> __i;
  QSharedDataPointer<QNetworkCacheMetaDataPrivate> *pQVar17;
  long in_FS_OFFSET;
  QLatin1String QVar18;
  QDateTime fileTime;
  QSharedDataPointer<QNetworkCacheMetaDataPrivate> *local_98;
  QNetworkCacheMetaData local_88;
  QSharedDataPointer<QNetworkCacheMetaDataPrivate> local_80;
  QSharedDataPointer<QNetworkCacheMetaDataPrivate> QStack_78;
  QSharedDataPointer<QNetworkCacheMetaDataPrivate> local_70;
  QSharedDataPointer<QNetworkCacheMetaDataPrivate> QStack_68;
  Data local_60;
  QSharedDataPointer<QNetworkCacheMetaDataPrivate> local_58;
  QTimeZone local_50;
  DirEntry local_48;
  QDirListing local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar13 = *(long *)(this + 8);
  lVar11 = *(long *)(lVar13 + 0xd0);
  if ((lVar11 < 0) || (*(long *)(lVar13 + 200) <= lVar11)) {
    pQVar1 = *(QArrayData **)(lVar13 + 0x98);
    lVar11 = *(long *)(lVar13 + 0xa8);
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
    if (lVar11 == 0) {
      expire();
      lVar11 = 0;
    }
    else {
      QNetworkCacheMetaData::QNetworkCacheMetaData(&local_88);
      QVar6.d.ptr = (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)
                    ((totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*> *)(lVar13 + 0x78))->
                    ptr;
      ((QSharedDataPointer<QNetworkCacheMetaDataPrivate> *)(lVar13 + 0x78))->d =
           (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)local_88.d.d.ptr;
      local_88.d.d.ptr =
           (QSharedDataPointer<QNetworkCacheMetaDataPrivate>)
           (QSharedDataPointer<QNetworkCacheMetaDataPrivate>)QVar6.d.ptr;
      QNetworkCacheMetaData::~QNetworkCacheMetaData(&local_88);
      QBuffer::close();
      if (*(long **)(lVar13 + 0x90) != (long *)0x0) {
        (**(code **)(**(long **)(lVar13 + 0x90) + 0x20))();
      }
      *(undefined8 *)(lVar13 + 0x90) = 0;
      lVar13 = *(long *)(this + 8);
      local_88.d.d.ptr =
           (QSharedDataPointer<QNetworkCacheMetaDataPrivate>)
           ((totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*> *)(lVar13 + 0x98))->ptr;
      local_80.d.ptr = *(totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*> *)(lVar13 + 0xa0);
      QStack_78.d.ptr = *(totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*> *)(lVar13 + 0xa8);
      if (local_88.d.d.ptr != (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)0x0) {
        LOCK();
        *(int *)local_88.d.d.ptr = *(int *)local_88.d.d.ptr + 1;
        UNLOCK();
      }
      QDirListing::QDirListing(local_40,&local_88,0x418);
      if (local_88.d.d.ptr != (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)0x0) {
        LOCK();
        *(int *)local_88.d.d.ptr = *(int *)local_88.d.d.ptr + -1;
        UNLOCK();
        if (*(int *)local_88.d.d.ptr == 0) {
          QArrayData::deallocate((QArrayData *)local_88.d.d.ptr,2,0x10);
        }
      }
      local_48.dirListPtr = (QDirListingPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      local_48.dirListPtr = (QDirListingPrivate *)QDirListing::begin();
      if (local_48.dirListPtr == (QDirListingPrivate *)0x0) {
        local_98 = (QSharedDataPointer<QNetworkCacheMetaDataPrivate> *)0x0;
        pQVar15 = (QSharedDataPointer<QNetworkCacheMetaDataPrivate> *)0x0;
        pQVar8 = (QSharedDataPointer<QNetworkCacheMetaDataPrivate> *)0x0;
        lVar11 = 0;
      }
      else {
        lVar11 = 0;
        pQVar15 = (QSharedDataPointer<QNetworkCacheMetaDataPrivate> *)0x0;
        local_98 = (QSharedDataPointer<QNetworkCacheMetaDataPrivate> *)0x0;
        pQVar17 = (QSharedDataPointer<QNetworkCacheMetaDataPrivate> *)0x0;
        do {
          QDirListing::DirEntry::fileName();
          QVar18.m_data = (char *)0x2;
          QVar18.m_size = (qsizetype)&local_88;
          cVar5 = QString::endsWith(QVar18,0x268fca);
          if (local_88.d.d.ptr != (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)0x0) {
            LOCK();
            *(int *)local_88.d.d.ptr = *(int *)local_88.d.d.ptr + -1;
            UNLOCK();
            if (*(int *)local_88.d.d.ptr == 0) {
              QArrayData::deallocate((QArrayData *)local_88.d.d.ptr,2,0x10);
            }
          }
          pQVar8 = pQVar17;
          if (cVar5 != '\0') {
            QDirListing::DirEntry::fileInfo();
            local_58.d.ptr =
                 (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)&DAT_aaaaaaaaaaaaaaaa;
            local_88.d.d.ptr =
                 (QSharedDataPointer<QNetworkCacheMetaDataPrivate>)
                 (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)0x2;
            QFileInfo::fileTime((FileTime)&local_58,&local_50);
            QTimeZone::~QTimeZone((QTimeZone *)&local_88);
            cVar5 = QDateTime::isValid();
            if (cVar5 == '\0') {
              local_60 = (Data)0x2;
              QFileInfo::fileTime((FileTime)(QDateTime *)&local_88,&local_50);
              QVar6.d.ptr = local_58.d.ptr;
              local_58.d.ptr =
                   (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)
                   (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)local_88.d.d.ptr;
              local_88.d.d.ptr =
                   (QSharedDataPointer<QNetworkCacheMetaDataPrivate>)
                   (QSharedDataPointer<QNetworkCacheMetaDataPrivate>)QVar6.d.ptr;
              QDateTime::~QDateTime((QDateTime *)&local_88);
              QTimeZone::~QTimeZone((QTimeZone *)&local_60.s);
            }
            QVar6.d.ptr = (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)
                          QDateTime::toMSecsSinceEpoch();
            QVar7.d.ptr = (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)QFileInfo::size()
            ;
            local_88.d.d.ptr =
                 (QSharedDataPointer<QNetworkCacheMetaDataPrivate>)
                 (QSharedDataPointer<QNetworkCacheMetaDataPrivate>)QVar6.d.ptr;
            QFileInfo::filePath();
            QVar4.d.ptr = local_70.d.ptr;
            QVar3.d.ptr = QStack_78.d.ptr;
            QVar6.d.ptr = local_80.d.ptr;
            QStack_68.d.ptr = QVar7.d.ptr;
            if (pQVar15 == local_98) {
              if ((long)pQVar15 - (long)pQVar17 == 0x7ffffffffffffff8) goto LAB_001d7ed5;
              lVar13 = (long)pQVar15 - (long)pQVar17 >> 3;
              uVar14 = lVar13 * -0x3333333333333333;
              uVar10 = uVar14;
              if (pQVar15 == pQVar17) {
                uVar10 = 1;
              }
              uVar12 = uVar10 + uVar14;
              if (0x333333333333332 < uVar12) {
                uVar12 = 0x333333333333333;
              }
              if (CARRY8(uVar10,uVar14)) {
                uVar12 = 0x333333333333333;
              }
              if (uVar12 == 0) {
                pQVar8 = (QSharedDataPointer<QNetworkCacheMetaDataPrivate> *)0x0;
              }
              else {
                pQVar8 = (QSharedDataPointer<QNetworkCacheMetaDataPrivate> *)
                         operator_new(uVar12 * 0x28);
              }
              QVar4.d.ptr = local_70.d.ptr;
              QVar3.d.ptr = QStack_78.d.ptr;
              QVar6.d.ptr = local_80.d.ptr;
              pQVar8[lVar13].d =
                   (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)local_88.d.d.ptr;
              local_80.d.ptr =
                   (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)
                   (QNetworkCacheMetaDataPrivate *)0x0;
              QStack_78.d.ptr =
                   (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)
                   (QNetworkCacheMetaDataPrivate *)0x0;
              pQVar8[lVar13 + 1].d = QVar6.d.ptr;
              (pQVar8 + lVar13 + 1)[1].d = QVar3.d.ptr;
              local_70.d.ptr =
                   (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)
                   (QNetworkCacheMetaDataPrivate *)0x0;
              pQVar8[lVar13 + 3].d = QVar4.d.ptr;
              (pQVar8 + lVar13 + 3)[1].d = QStack_68.d.ptr;
              pQVar16 = pQVar8;
              for (pQVar9 = pQVar17; pQVar15 != pQVar9; pQVar9 = pQVar9 + 5) {
                pQVar16->d = (QNetworkCacheMetaDataPrivate *)pQVar9->d;
                QVar6.d.ptr = pQVar9[1].d;
                QVar3.d.ptr = pQVar9[2].d;
                pQVar9[1].d = (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)0x0;
                pQVar9[2].d = (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)0x0;
                pQVar16[1].d = QVar6.d.ptr;
                pQVar16[2].d = QVar3.d.ptr;
                QVar6.d.ptr = pQVar9[3].d;
                QVar3.d.ptr = pQVar9[4].d;
                pQVar9[3].d = (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)0x0;
                pQVar16[3].d = QVar6.d.ptr;
                pQVar16[4].d = QVar3.d.ptr;
                pQVar16 = pQVar16 + 5;
              }
              if (pQVar17 != (QSharedDataPointer<QNetworkCacheMetaDataPrivate> *)0x0) {
                operator_delete(pQVar17,(long)local_98 - (long)pQVar17);
              }
              local_98 = pQVar8 + uVar12 * 5;
            }
            else {
              pQVar15->d = (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)local_88.d.d.ptr
              ;
              local_80.d.ptr =
                   (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)
                   (QNetworkCacheMetaDataPrivate *)0x0;
              pQVar15[1].d = QVar6.d.ptr;
              QStack_78.d.ptr =
                   (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)
                   (QNetworkCacheMetaDataPrivate *)0x0;
              pQVar15[2].d = QVar3.d.ptr;
              local_70.d.ptr =
                   (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)
                   (QNetworkCacheMetaDataPrivate *)0x0;
              pQVar15[3].d = QVar4.d.ptr;
              pQVar15[4].d = QVar7.d.ptr;
              pQVar16 = pQVar15;
            }
            pQVar15 = pQVar16 + 5;
            if (pQVar8 == pQVar15) {
              expire();
LAB_001d7ed5:
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            if (local_80.d.ptr != (QNetworkCacheMetaDataPrivate *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_80.d.ptr)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_80.d.ptr)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_80.d.ptr)->_q_value).super___atomic_base<int>._M_i == 0
                 ) {
                QArrayData::deallocate((QArrayData *)local_80.d.ptr,2,0x10);
              }
            }
            lVar11 = lVar11 + (long)QVar7.d.ptr;
            QDateTime::~QDateTime((QDateTime *)&local_58);
            QFileInfo::~QFileInfo((QFileInfo *)&local_50);
          }
          local_48.dirListPtr = (QDirListingPrivate *)QDirListing::next(local_48);
          pQVar17 = pQVar8;
        } while (local_48.dirListPtr != (QDirListingPrivate *)0x0);
      }
      local_48.dirListPtr = (QDirListingPrivate *)0x0;
      QDirListing::~QDirListing(local_40);
      lVar13 = (*(long *)(*(long *)(this + 8) + 200) * 9) / 10;
      pQVar17 = pQVar8;
      if (lVar13 <= lVar11) {
        pQVar16 = pQVar8;
        if (pQVar8 != pQVar15) {
          uVar10 = ((long)pQVar15 - (long)pQVar8 >> 3) * -0x3333333333333333;
          lVar2 = 0x3f;
          if (uVar10 != 0) {
            for (; uVar10 >> lVar2 == 0; lVar2 = lVar2 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<QNetworkDiskCache::expire()::CacheItem*,std::vector<QNetworkDiskCache::expire()::CacheItem,std::allocator<QNetworkDiskCache::expire()::CacheItem>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<QNetworkDiskCache::expire()::__0>>
                    (pQVar8,pQVar15,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
          if ((long)pQVar15 - (long)pQVar8 < 0x281) {
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<QNetworkDiskCache::expire()::CacheItem*,std::vector<QNetworkDiskCache::expire()::CacheItem,std::allocator<QNetworkDiskCache::expire()::CacheItem>>>,__gnu_cxx::__ops::_Iter_comp_iter<QNetworkDiskCache::expire()::__0>>
                      (pQVar8,pQVar15);
          }
          else {
            pQVar9 = pQVar8 + 0x50;
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<QNetworkDiskCache::expire()::CacheItem*,std::vector<QNetworkDiskCache::expire()::CacheItem,std::allocator<QNetworkDiskCache::expire()::CacheItem>>>,__gnu_cxx::__ops::_Iter_comp_iter<QNetworkDiskCache::expire()::__0>>
                      (pQVar8,pQVar9);
            for (; pQVar9 != pQVar15; pQVar9 = pQVar9 + 5) {
              std::
              __unguarded_linear_insert<__gnu_cxx::__normal_iterator<QNetworkDiskCache::expire()::CacheItem*,std::vector<QNetworkDiskCache::expire()::CacheItem,std::allocator<QNetworkDiskCache::expire()::CacheItem>>>,__gnu_cxx::__ops::_Val_comp_iter<QNetworkDiskCache::expire()::__0>>
                        (pQVar9);
            }
          }
        }
        do {
          if (pQVar16 == pQVar15) break;
          QFile::remove((QString *)(pQVar16 + 1));
          lVar11 = lVar11 - (long)pQVar16[4].d;
          pQVar16 = pQVar16 + 5;
        } while (lVar13 <= lVar11);
      }
      for (; pQVar17 != pQVar15; pQVar17 = pQVar17 + 5) {
        QVar6.d.ptr = pQVar17[1].d;
        if (QVar6.d.ptr != (QNetworkCacheMetaDataPrivate *)0x0) {
          LOCK();
          *(int *)QVar6.d.ptr = *(int *)QVar6.d.ptr + -1;
          UNLOCK();
          if (*(int *)QVar6.d.ptr == 0) {
            QArrayData::deallocate((QArrayData *)pQVar17[1].d,2,0x10);
          }
        }
      }
      if (pQVar8 != (QSharedDataPointer<QNetworkCacheMetaDataPrivate> *)0x0) {
        operator_delete(pQVar8,(long)local_98 - (long)pQVar8);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return lVar11;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QNetworkDiskCache::expire()
{
    Q_D(QNetworkDiskCache);
    if (d->currentCacheSize >= 0 && d->currentCacheSize < maximumCacheSize())
        return d->currentCacheSize;

    if (cacheDirectory().isEmpty()) {
        qWarning("QNetworkDiskCache::expire() The cache directory is not set");
        return 0;
    }

    // close file handle to prevent "in use" error when QFile::remove() is called
    d->lastItem.reset();

    struct CacheItem
    {
        std::chrono::milliseconds msecs;
        QString path;
        qint64 size = 0;
    };
    std::vector<CacheItem> cacheItems;
    qint64 totalSize = 0;
    using F = QDirListing::IteratorFlag;
    for (const auto &dirEntry : QDirListing(cacheDirectory(), F::FilesOnly | F::Recursive)) {
        if (!dirEntry.fileName().endsWith(CACHE_POSTFIX))
            continue;

        const QFileInfo &info = dirEntry.fileInfo();
        QDateTime fileTime = info.birthTime(QTimeZone::UTC);
        if (!fileTime.isValid())
            fileTime = info.metadataChangeTime(QTimeZone::UTC);
        const std::chrono::milliseconds msecs{fileTime.toMSecsSinceEpoch()};
        const qint64 size = info.size();
        cacheItems.push_back(CacheItem{msecs, info.filePath(), size});
        totalSize += size;
    }

    const qint64 goal = (maximumCacheSize() * 9) / 10;
    if (totalSize < goal)
        return totalSize; // Nothing to do

    auto byFileTime = [&](const auto &a, const auto &b) { return a.msecs < b.msecs; };
    std::sort(cacheItems.begin(), cacheItems.end(), byFileTime);

    [[maybe_unused]] int removedFiles = 0; // used under QNETWORKDISKCACHE_DEBUG
    for (const CacheItem &cached : cacheItems) {
        QFile::remove(cached.path);
        ++removedFiles;
        totalSize -= cached.size;
        if (totalSize < goal)
            break;
    }
#if defined(QNETWORKDISKCACHE_DEBUG)
    if (removedFiles > 0) {
        qDebug() << "QNetworkDiskCache::expire()"
                << "Removed:" << removedFiles
                << "Kept:" << cacheItems.count() - removedFiles;
    }
#endif
    return totalSize;
}